

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-hex.c
# Opt level: O3

void test_hex_decode(void)

{
  int iVar1;
  size_t sVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  char hex [35];
  char buffer [256];
  char local_148 [48];
  char local_118;
  char cStack_117;
  char cStack_116;
  char cStack_115;
  char cStack_114;
  char cStack_113;
  char cStack_112;
  char cStack_111;
  char cStack_110;
  char cStack_10f;
  char cStack_10e;
  char cStack_10d;
  char cStack_10c;
  char cStack_10b;
  char cStack_10a;
  char cStack_109;
  char local_108;
  
  builtin_strncpy(local_148,"000102030405060708090a0B0c0D0e0fFf",0x23);
  sVar2 = strlen(local_148);
  iVar1 = hex_decode(local_148,(uint)sVar2,&local_118,0x100);
  acutest_check_((uint)(iVar1 == 0x11),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-hex.c"
                 ,0x37,"%s","hex_decode(hex, strlen(hex), buffer, sizeof(buffer)) == sizeof(expect)"
                );
  auVar3[0] = -(local_118 == '\0');
  auVar3[1] = -(cStack_117 == '\x01');
  auVar3[2] = -(cStack_116 == '\x02');
  auVar3[3] = -(cStack_115 == '\x03');
  auVar3[4] = -(cStack_114 == '\x04');
  auVar3[5] = -(cStack_113 == '\x05');
  auVar3[6] = -(cStack_112 == '\x06');
  auVar3[7] = -(cStack_111 == '\a');
  auVar3[8] = -(cStack_110 == '\b');
  auVar3[9] = -(cStack_10f == '\t');
  auVar3[10] = -(cStack_10e == '\n');
  auVar3[0xb] = -(cStack_10d == '\v');
  auVar3[0xc] = -(cStack_10c == '\f');
  auVar3[0xd] = -(cStack_10b == '\r');
  auVar3[0xe] = -(cStack_10a == '\x0e');
  auVar3[0xf] = -(cStack_109 == '\x0f');
  auVar4[0] = -(local_108 == -1);
  auVar4[1] = 0xff;
  auVar4[2] = 0xff;
  auVar4[3] = 0xff;
  auVar4[4] = 0xff;
  auVar4[5] = 0xff;
  auVar4[6] = 0xff;
  auVar4[7] = 0xff;
  auVar4[8] = 0xff;
  auVar4[9] = 0xff;
  auVar4[10] = 0xff;
  auVar4[0xb] = 0xff;
  auVar4[0xc] = 0xff;
  auVar4[0xd] = 0xff;
  auVar4[0xe] = 0xff;
  auVar4[0xf] = 0xff;
  auVar4 = auVar4 & auVar3;
  acutest_check_((uint)((ushort)((ushort)(SUB161(auVar4 >> 7,0) & 1) |
                                 (ushort)(SUB161(auVar4 >> 0xf,0) & 1) << 1 |
                                 (ushort)(SUB161(auVar4 >> 0x17,0) & 1) << 2 |
                                 (ushort)(SUB161(auVar4 >> 0x1f,0) & 1) << 3 |
                                 (ushort)(SUB161(auVar4 >> 0x27,0) & 1) << 4 |
                                 (ushort)(SUB161(auVar4 >> 0x2f,0) & 1) << 5 |
                                 (ushort)(SUB161(auVar4 >> 0x37,0) & 1) << 6 |
                                 (ushort)(SUB161(auVar4 >> 0x3f,0) & 1) << 7 |
                                 (ushort)(SUB161(auVar4 >> 0x47,0) & 1) << 8 |
                                 (ushort)(SUB161(auVar4 >> 0x4f,0) & 1) << 9 |
                                 (ushort)(SUB161(auVar4 >> 0x57,0) & 1) << 10 |
                                 (ushort)(SUB161(auVar4 >> 0x5f,0) & 1) << 0xb |
                                 (ushort)(SUB161(auVar4 >> 0x67,0) & 1) << 0xc |
                                 (ushort)(SUB161(auVar4 >> 0x6f,0) & 1) << 0xd |
                                 (ushort)(SUB161(auVar4 >> 0x77,0) & 1) << 0xe |
                                (ushort)(byte)(auVar4[0xf] >> 7) << 0xf) == 0xffff),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-hex.c"
                 ,0x38,"%s","memcmp(buffer, expect, sizeof(expect)) == 0");
  return;
}

Assistant:

static void
test_hex_decode(void)
{
    /* Keep the visually ugly mixed lower and upper case here. */
    char hex[] = "000102030405060708090a0B0c0D0e0fFf";
    char buffer[256];
    char expect[] = { 0, 1, 2, 3, 4, 5, 6, 7, 8, 9, 10, 11, 12, 13, 14, 15, 0xff };

    TEST_CHECK(hex_decode(hex, strlen(hex), buffer, sizeof(buffer)) == sizeof(expect));
    TEST_CHECK(memcmp(buffer, expect, sizeof(expect)) == 0);
}